

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

void __thiscall lest::message::~message(message *this)

{
  *(undefined ***)this = &PTR__message_0013da48;
  std::__cxx11::string::~string((string *)&this->note);
  std::__cxx11::string::~string((string *)&this->where);
  std::__cxx11::string::~string((string *)&this->kind);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

~message() throw() {}